

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O0

bool __thiscall
rapidjson::
Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteInt64(Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
             *this,int64_t i64)

{
  char **ppcVar1;
  char **local_48;
  char *p;
  char *end;
  char buffer [21];
  int64_t i64_local;
  Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *this_local;
  
  ppcVar1 = (char **)internal::i64toa(i64,(char *)&end);
  PutReserve<rapidjson::BasicOStreamWrapper<std::ostream>>(this->os_,(long)ppcVar1 - (long)&end);
  for (local_48 = &end; local_48 != ppcVar1; local_48 = (char **)((long)local_48 + 1)) {
    PutUnsafe<rapidjson::BasicOStreamWrapper<std::ostream>>(this->os_,*(Ch *)local_48);
  }
  return true;
}

Assistant:

bool WriteInt64(int64_t i64) {
        char buffer[21];
        const char* end = internal::i64toa(i64, buffer);
        PutReserve(*os_, static_cast<size_t>(end - buffer));
        for (const char* p = buffer; p != end; ++p)
            PutUnsafe(*os_, static_cast<typename OutputStream::Ch>(*p));
        return true;
    }